

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O0

unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> __thiscall
flow::BasicBlock::replace
          (BasicBlock *this,Instr *oldInstr,
          unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *newInstr)

{
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *puVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  pointer pIVar4;
  TerminateInstr *pTVar5;
  reference puVar6;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *in_RCX;
  long local_c0;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  local_70;
  Instr **local_68;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *local_60;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  local_58;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  local_50;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  i;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_38;
  undefined1 local_29;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *newInstr_local;
  Instr *oldInstr_local;
  BasicBlock *this_local;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *removedInstr;
  
  newInstr_local = newInstr;
  oldInstr_local = oldInstr;
  this_local = this;
  pBVar3 = Instr::getBasicBlock((Instr *)newInstr);
  if (pBVar3 != (BasicBlock *)oldInstr) {
    __assert_fail("oldInstr->getBasicBlock() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x56,
                  "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                 );
  }
  pIVar4 = std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::operator->(in_RCX);
  pBVar3 = Instr::getBasicBlock(pIVar4);
  puVar1 = newInstr_local;
  if (pBVar3 != (BasicBlock *)0x0) {
    __assert_fail("newInstr->getBasicBlock() == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x57,
                  "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                 );
  }
  pIVar4 = std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::get(in_RCX);
  Value::replaceAllUsesWith((Value *)puVar1,&pIVar4->super_Value);
  puVar1 = newInstr_local;
  pTVar5 = getTerminator((BasicBlock *)oldInstr);
  if ((TerminateInstr *)puVar1 == pTVar5) {
    local_29 = 0;
    remove(this,(char *)oldInstr);
    std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::unique_ptr(&local_38,in_RCX);
    push_back((BasicBlock *)oldInstr,&local_38);
    std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_38);
  }
  else {
    pIVar4 = std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::get(in_RCX);
    if (pIVar4 == (pointer)0x0) {
      local_c0 = 0;
    }
    else {
      local_c0 = __dynamic_cast(pIVar4,&Instr::typeinfo,&TerminateInstr::typeinfo,0);
    }
    if (local_c0 != 0) {
      __assert_fail("dynamic_cast<TerminateInstr*>(newInstr.get()) == nullptr && \"Most not be a terminator instruction.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                    ,0x60,
                    "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                   );
    }
    local_58._M_current =
         (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
         std::
         vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
         ::begin((vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                  *)&oldInstr->operands_);
    local_60 = (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
               std::
               vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
               ::end((vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                      *)&oldInstr->operands_);
    local_68 = (Instr **)&newInstr_local;
    local_50 = std::
               find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>*,std::vector<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>,std::allocator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>>>,flow::BasicBlock::replace(flow::Instr*,std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>)::__0>
                         (local_58,(__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                                    )local_60,(anon_class_8_1_f28caa83_for__M_pred)local_68);
    local_70._M_current =
         (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
         std::
         vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
         ::end((vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                *)&oldInstr->operands_);
    bVar2 = __gnu_cxx::operator!=(&local_50,&local_70);
    if (!bVar2) {
      __assert_fail("i != code_.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                    ,0x66,
                    "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                   );
    }
    Instr::setParent((Instr *)newInstr_local,(BasicBlock *)0x0);
    pIVar4 = std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::operator->(in_RCX);
    Instr::setParent(pIVar4,(BasicBlock *)oldInstr);
    puVar6 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
             ::operator*(&local_50);
    std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::unique_ptr
              ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)this,puVar6);
    puVar6 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
             ::operator*(&local_50);
    std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::operator=(puVar6,in_RCX);
  }
  return (__uniq_ptr_data<flow::Instr,_std::default_delete<flow::Instr>,_true,_true>)
         (__uniq_ptr_data<flow::Instr,_std::default_delete<flow::Instr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Instr> BasicBlock::replace(Instr* oldInstr,
                                           std::unique_ptr<Instr> newInstr) {
  assert(oldInstr->getBasicBlock() == this);
  assert(newInstr->getBasicBlock() == nullptr);

  oldInstr->replaceAllUsesWith(newInstr.get());

  if (oldInstr == getTerminator()) {
    std::unique_ptr<Instr> removedInstr = remove(oldInstr);
    push_back(std::move(newInstr));
    return removedInstr;
  } else {
    assert(dynamic_cast<TerminateInstr*>(newInstr.get()) == nullptr && "Most not be a terminator instruction.");

    auto i = std::find_if(
        code_.begin(), code_.end(),
        [&](const auto& obj) { return obj.get() == oldInstr; });

    assert(i != code_.end());

    oldInstr->setParent(nullptr);
    newInstr->setParent(this);

    std::unique_ptr<Instr> removedInstr = std::move(*i);
    *i = std::move(newInstr);
    return removedInstr;
  }
}